

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears_engine.c
# Opt level: O0

int gears_engine_init(gears_engine_t *gears_engine,int width,int height)

{
  gears_t *pgVar1;
  int height_local;
  int width_local;
  gears_engine_t *gears_engine_local;
  
  if (gears_engine == (gears_engine_t *)0x0) {
    gears_engine_local._4_4_ = -1;
  }
  else {
    pgVar1 = (*gears_engine->engine->init)(width,height);
    gears_engine->gears = pgVar1;
    if (gears_engine->gears == (gears_t *)0x0) {
      gears_engine_local._4_4_ = -1;
    }
    else {
      gears_engine_local._4_4_ = 0;
    }
  }
  return gears_engine_local._4_4_;
}

Assistant:

int gears_engine_init(gears_engine_t *gears_engine, int width, int height)
{
  if (!gears_engine) {
    return -1;
  }

  gears_engine->gears = gears_engine->engine->init(width, height);
  if (!gears_engine->gears) {
    return -1;
  }

  return 0;
}